

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

void xmlFAReduceEpsilonTransitions(xmlRegParserCtxtPtr ctxt,int fromnr,int tonr,int counter)

{
  int iVar1;
  xmlRegStatePtr state;
  xmlRegStatePtr pxVar2;
  int newto_1;
  int newto;
  xmlRegStatePtr to;
  xmlRegStatePtr from;
  int transnr;
  int counter_local;
  int tonr_local;
  int fromnr_local;
  xmlRegParserCtxtPtr ctxt_local;
  
  state = ctxt->states[fromnr];
  if ((((state != (xmlRegStatePtr)0x0) &&
       (pxVar2 = ctxt->states[tonr], pxVar2 != (xmlRegStatePtr)0x0)) &&
      (pxVar2->mark != XML_REGEXP_MARK_START)) && (pxVar2->mark != XML_REGEXP_MARK_VISITED)) {
    pxVar2->mark = XML_REGEXP_MARK_VISITED;
    if (pxVar2->type == XML_REGEXP_FINAL_STATE) {
      state->type = XML_REGEXP_FINAL_STATE;
    }
    for (from._0_4_ = 0; (int)from < pxVar2->nbTrans; from._0_4_ = (int)from + 1) {
      if (-1 < pxVar2->trans[(int)from].to) {
        if (pxVar2->trans[(int)from].atom == (xmlRegAtomPtr)0x0) {
          if (pxVar2->trans[(int)from].to != fromnr) {
            if (pxVar2->trans[(int)from].count < 0) {
              if (pxVar2->trans[(int)from].counter < 0) {
                xmlFAReduceEpsilonTransitions(ctxt,fromnr,pxVar2->trans[(int)from].to,counter);
              }
              else {
                xmlFAReduceEpsilonTransitions
                          (ctxt,fromnr,pxVar2->trans[(int)from].to,pxVar2->trans[(int)from].counter)
                ;
              }
            }
            else {
              xmlRegStateAddTrans(ctxt,state,(xmlRegAtomPtr)0x0,
                                  ctxt->states[pxVar2->trans[(int)from].to],-1,
                                  pxVar2->trans[(int)from].count);
            }
          }
        }
        else {
          iVar1 = pxVar2->trans[(int)from].to;
          if (pxVar2->trans[(int)from].counter < 0) {
            xmlRegStateAddTrans(ctxt,state,pxVar2->trans[(int)from].atom,ctxt->states[iVar1],counter
                                ,-1);
          }
          else {
            xmlRegStateAddTrans(ctxt,state,pxVar2->trans[(int)from].atom,ctxt->states[iVar1],
                                pxVar2->trans[(int)from].counter,-1);
          }
        }
      }
    }
    pxVar2->mark = XML_REGEXP_MARK_NORMAL;
  }
  return;
}

Assistant:

static void
xmlFAReduceEpsilonTransitions(xmlRegParserCtxtPtr ctxt, int fromnr,
	                      int tonr, int counter) {
    int transnr;
    xmlRegStatePtr from;
    xmlRegStatePtr to;

#ifdef DEBUG_REGEXP_GRAPH
    printf("xmlFAReduceEpsilonTransitions(%d, %d)\n", fromnr, tonr);
#endif
    from = ctxt->states[fromnr];
    if (from == NULL)
	return;
    to = ctxt->states[tonr];
    if (to == NULL)
	return;
    if ((to->mark == XML_REGEXP_MARK_START) ||
	(to->mark == XML_REGEXP_MARK_VISITED))
	return;

    to->mark = XML_REGEXP_MARK_VISITED;
    if (to->type == XML_REGEXP_FINAL_STATE) {
#ifdef DEBUG_REGEXP_GRAPH
	printf("State %d is final, so %d becomes final\n", tonr, fromnr);
#endif
	from->type = XML_REGEXP_FINAL_STATE;
    }
    for (transnr = 0;transnr < to->nbTrans;transnr++) {
        if (to->trans[transnr].to < 0)
	    continue;
	if (to->trans[transnr].atom == NULL) {
	    /*
	     * Don't remove counted transitions
	     * Don't loop either
	     */
	    if (to->trans[transnr].to != fromnr) {
		if (to->trans[transnr].count >= 0) {
		    int newto = to->trans[transnr].to;

		    xmlRegStateAddTrans(ctxt, from, NULL,
					ctxt->states[newto],
					-1, to->trans[transnr].count);
		} else {
#ifdef DEBUG_REGEXP_GRAPH
		    printf("Found epsilon trans %d from %d to %d\n",
			   transnr, tonr, to->trans[transnr].to);
#endif
		    if (to->trans[transnr].counter >= 0) {
			xmlFAReduceEpsilonTransitions(ctxt, fromnr,
					      to->trans[transnr].to,
					      to->trans[transnr].counter);
		    } else {
			xmlFAReduceEpsilonTransitions(ctxt, fromnr,
					      to->trans[transnr].to,
					      counter);
		    }
		}
	    }
	} else {
	    int newto = to->trans[transnr].to;

	    if (to->trans[transnr].counter >= 0) {
		xmlRegStateAddTrans(ctxt, from, to->trans[transnr].atom,
				    ctxt->states[newto],
				    to->trans[transnr].counter, -1);
	    } else {
		xmlRegStateAddTrans(ctxt, from, to->trans[transnr].atom,
				    ctxt->states[newto], counter, -1);
	    }
	}
    }
    to->mark = XML_REGEXP_MARK_NORMAL;
}